

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamReader.h
# Opt level: O2

int __thiscall Assimp::StreamReader<false,_false>::Get<int>(StreamReader<false,_false> *this)

{
  int *piVar1;
  int iVar2;
  DeadlyImportError *this_00;
  allocator<char> local_39;
  string local_38;
  
  piVar1 = (int *)((long)this->current + 4);
  if (piVar1 <= this->limit) {
    iVar2 = *(int *)this->current;
    this->current = (int8_t *)piVar1;
    return iVar2;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"End of file or stream limit was reached",&local_39);
  DeadlyImportError::DeadlyImportError(this_00,&local_38);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T Get() {
        if ( current + sizeof(T) > limit) {
            throw DeadlyImportError("End of file or stream limit was reached");
        }

        T f;
        ::memcpy (&f, current, sizeof(T));
        Intern::Getter<SwapEndianess,T,RuntimeSwitch>() (&f,le);
        current += sizeof(T);

        return f;
    }